

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_def_set(void *p,HistEvent *ev,int n)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  
  if (*(int *)((long)p + 0x34) == 0) {
    pcVar2 = "empty list";
    iVar3 = 5;
  }
  else {
    piVar1 = (int *)p;
    if ((*(int **)((long)p + 0x28) == (int *)p) || (**(int **)((long)p + 0x28) != n)) {
      do {
        piVar1 = *(int **)(piVar1 + 6);
        if (piVar1 == (int *)p) break;
      } while (*piVar1 != n);
      *(int **)((long)p + 0x28) = piVar1;
    }
    if (*(void **)((long)p + 0x28) != p) {
      return 0;
    }
    pcVar2 = "event not found";
    iVar3 = 9;
  }
  ev->num = iVar3;
  ev->str = pcVar2;
  return -1;
}

Assistant:

static int
history_def_set(void *p, TYPE(HistEvent) *ev, const int n)
{
	history_t *h = (history_t *) p;

	if (h->cur == 0) {
		he_seterrev(ev, _HE_EMPTY_LIST);
		return -1;
	}
	if (h->cursor == &h->list || h->cursor->ev.num != n) {
		for (h->cursor = h->list.next; h->cursor != &h->list;
		    h->cursor = h->cursor->next)
			if (h->cursor->ev.num == n)
				break;
	}
	if (h->cursor == &h->list) {
		he_seterrev(ev, _HE_NOT_FOUND);
		return -1;
	}
	return 0;
}